

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

void __thiscall toml::internal::Parser::nextKey(Parser *this)

{
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  int64_t local_28;
  double dStack_20;
  time_point local_18;
  
  Lexer::nextToken((Token *)local_50,&this->lexer_,false);
  (this->token_).type_ = local_50._0_4_;
  std::__cxx11::string::operator=((string *)&(this->token_).str_value_,(string *)&local_48);
  (this->token_).time_value_.__d.__r = (rep)local_18.__d.__r;
  (this->token_).int_value_ = local_28;
  (this->token_).double_value_ = dStack_20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void nextKey() { token_ = lexer_.nextKeyToken(); }